

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

Node __thiscall xt::vector::doAssoc(vector *this,uint level,Node *node,uint i,Object *val)

{
  element_type *peVar1;
  __shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint uVar3;
  Node NVar4;
  shared_ptr<void> local_c0;
  shared_ptr<xt::_Node> local_b0;
  __shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  local_a0;
  Object local_90;
  Object local_70;
  Object local_50;
  
  this_00 = (__shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
             *)operator_new(0x10);
  new_object_array((xt *)&local_a0,0x20);
  std::
  __shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(this_00,&local_a0);
  std::__shared_ptr<xt::_Node,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<xt::_Node,void>
            ((__shared_ptr<xt::_Node,(__gnu_cxx::_Lock_policy)2> *)this,(_Node *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  peVar1 = (((node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->array).
           super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::
  __copy_move_a<false,__gnu_cxx::__normal_iterator<xt::Object*,std::vector<xt::Object,std::allocator<xt::Object>>>,__gnu_cxx::__normal_iterator<xt::Object*,std::vector<xt::Object,std::allocator<xt::Object>>>>
            (*(Object **)
              &(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl,
             *(pointer *)
              ((long)&(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl
              + 8),*(Object **)**(undefined8 **)this);
  if (level == 0) {
    Object::operator=((Object *)((ulong)((i & 0x1f) << 5) + *(long *)**(undefined8 **)this),val);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    uVar3 = i >> ((byte)level & 0x1f) & 0x1f;
    Object::Object(&local_70,
                   (Object *)
                   ((ulong)(uVar3 << 5) +
                   *(long *)&(((((node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->array).
                               super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)
                             ._M_impl));
    std::static_pointer_cast<xt::_Node,void>(&local_c0);
    Object::Object(&local_90,val);
    doAssoc((vector *)&local_b0,level - 5,(Node *)&local_c0,i,&local_90);
    Object::Object<xt::_Node>(&local_50,&local_b0);
    Object::operator=((Object *)((ulong)(uVar3 << 5) + *(long *)**(undefined8 **)this),&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c0.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var2._M_pi = extraout_RDX;
  }
  NVar4.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  NVar4.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar4.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node doAssoc(unsigned int level, Node node, unsigned int i, Object val) {
	Node ret = Node(new _Node {new_object_array(32)});
	std::copy(node->array->begin(), node->array->end(), ret->array->begin());
	if (level == 0)
		(*ret->array)[i & 0x01f] = val;
	else {
		unsigned int subidx = (i >> level) & 0x01f;
		(*ret->array)[subidx] = doAssoc(level - 5, to_node((*node->array)[subidx]), i, val);
	}
	return ret;
}